

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTDMT_CCtxParam_setMTCtxParameter
                 (ZSTD_CCtx_params *params,ZSTDMT_parameter parameter,int value)

{
  size_t sVar1;
  
  if (parameter < (ZSTDMT_p_rsyncable|ZSTDMT_p_overlapLog)) {
    sVar1 = ZSTD_CCtxParams_setParameter
                      (params,*(ZSTD_cParameter *)(&DAT_00191480 + (ulong)parameter * 4),value);
    return sVar1;
  }
  return 0xffffffffffffffd8;
}

Assistant:

size_t
ZSTDMT_CCtxParam_setMTCtxParameter(ZSTD_CCtx_params* params,
                                   ZSTDMT_parameter parameter,
                                   int value)
{
    DEBUGLOG(4, "ZSTDMT_CCtxParam_setMTCtxParameter");
    switch(parameter)
    {
    case ZSTDMT_p_jobSize :
        DEBUGLOG(4, "ZSTDMT_CCtxParam_setMTCtxParameter : set jobSize to %i", value);
        return ZSTD_CCtxParams_setParameter(params, ZSTD_c_jobSize, value);
    case ZSTDMT_p_overlapLog :
        DEBUGLOG(4, "ZSTDMT_p_overlapLog : %i", value);
        return ZSTD_CCtxParams_setParameter(params, ZSTD_c_overlapLog, value);
    case ZSTDMT_p_rsyncable :
        DEBUGLOG(4, "ZSTD_p_rsyncable : %i", value);
        return ZSTD_CCtxParams_setParameter(params, ZSTD_c_rsyncable, value);
    default :
        return ERROR(parameter_unsupported);
    }
}